

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void PatternMatch_TypeDecl(KonohaContext *kctx,KonohaStack *sfp)

{
  kArray *tokenList_00;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  kArray *in_RSI;
  kNameSpace *in_RDI;
  KonohaContext *unaff_retaddr;
  kToken *tk;
  int nextIdx;
  KClass *foundClass;
  kNameSpace *ns;
  int endIdx;
  int beginIdx;
  kArray *tokenList;
  ksymbol_t name;
  kNode *stmt;
  int in_stack_000000cc;
  kArray *in_stack_000000d0;
  kSyntax *in_stack_000000d8;
  kNode *in_stack_000000e0;
  kNameSpace *in_stack_000000e8;
  KonohaContext *in_stack_000000f0;
  int in_stack_00000120;
  undefined4 in_stack_ffffffffffffffe0;
  kNode *node;
  
  node = (kNode *)(in_RSI->h).prototypePtr;
  uVar1 = (undefined4)in_RSI->bytemax;
  tokenList_00 = (kArray *)in_RSI[1].h.magicflag;
  iVar3 = (int)in_RSI[2].h.ct;
  (*(((PlatformApi *)(in_RDI->h).prototypePtr)->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_TypeDecl",0x7f,"tracing..");
  kNode_GetNameSpace((KonohaContext *)in_RDI,node);
  iVar2 = ParseTypePattern(unaff_retaddr,in_RDI,in_RSI,(int)((ulong)node >> 0x20),(int)node,
                           (KClass **)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  if (((iVar2 == -1) || (iVar2 = TokenUtils_SkipIndent(tokenList_00,iVar2,iVar3), iVar3 <= iVar2))
     || (*(int *)((tokenList_00->field_2).unboxItems[iVar2] + 0x28) != -0x1ffffffe)) {
    in_RSI[-2].bytemax = 0xffffffffffffffff;
  }
  else {
    iVar3 = ParseSyntaxPattern(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                               in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                               in_stack_00000120);
    in_RSI[-2].bytemax = (long)iVar3;
  }
  return;
}

Assistant:

static KMETHOD PatternMatch_TypeDecl(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	kNameSpace *ns = kNode_ns(stmt);
	KClass *foundClass = NULL;
	int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
	//DBG_P("@ nextIdx = %d < %d", nextIdx, endIdx);
	if(nextIdx != -1) {
		nextIdx = TokenUtils_SkipIndent(tokenList, nextIdx, endIdx);
		if(nextIdx < endIdx) {
			kToken *tk = tokenList->TokenItems[nextIdx];
			if(tk->tokenType == KSymbol_SymbolPattern) {
				KReturnUnboxValue(ParseSyntaxPattern(kctx, ns, stmt, stmt->syn, tokenList, beginIdx, endIdx));
			}
		}
	}
	KReturnUnboxValue(-1);
}